

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deSocket * deSocket_create(void)

{
  deSocket *pdVar1;
  deMutex dVar2;
  deSocket *sock;
  
  pdVar1 = (deSocket *)deCalloc(0x18);
  if (pdVar1 != (deSocket *)0x0) {
    dVar2 = deMutex_create((deMutexAttributes *)0x0);
    pdVar1->stateLock = dVar2;
    pdVar1->handle = -1;
    pdVar1->state = DE_SOCKETSTATE_CLOSED;
  }
  return pdVar1;
}

Assistant:

deSocket* deSocket_create (void)
{
	deSocket* sock = (deSocket*)deCalloc(sizeof(deSocket));
	if (!sock)
		return sock;

#if defined(DE_USE_WINSOCK)
	/* Make sure WSA is up. */
	if (!initWinsock())
		return DE_NULL;
#endif

	sock->stateLock	= deMutex_create(0);
	sock->handle	= DE_INVALID_SOCKET_HANDLE;
	sock->state		= DE_SOCKETSTATE_CLOSED;

	return sock;
}